

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O1

void __thiscall
cppjieba::Trie::Find
          (Trie *this,const_iterator begin,const_iterator end,
          vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *res,size_t max_word_len)

{
  ulong uVar1;
  pointer pDVar2;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *pvVar7;
  __node_base_ptr p_Var8;
  _Hash_node_base *p_Var9;
  ulong uVar10;
  ulong uVar11;
  const_iterator pRVar12;
  ulong uVar13;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> local_78;
  size_type local_68;
  const_iterator local_60;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *local_58;
  ulong local_50;
  const_iterator local_48;
  Trie *local_40;
  size_t local_38;
  
  local_40 = this;
  local_38 = max_word_len;
  if (this->root_ == (TrieNode *)0x0) {
    __assert_fail("root_ != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/Trie.hpp"
                  ,0x55,
                  "void cppjieba::Trie::Find(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<struct Dag> &, size_t) const"
                 );
  }
  local_68 = ((long)end - (long)begin >> 2) * -0x3333333333333333;
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::resize(res,local_68);
  if (end != begin) {
    local_50 = local_68 + (local_68 == 0);
    local_60 = begin + 1;
    uVar13 = 0;
    local_58 = res;
    local_48 = begin;
    do {
      pvVar7 = local_58;
      pDVar2 = (local_58->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pDVar2[uVar13].runestr.unicode_length = local_48[uVar13].unicode_length;
      pRVar12 = local_48 + uVar13;
      uVar4 = pRVar12->offset;
      uVar5 = pRVar12->len;
      uVar6 = pRVar12->unicode_offset;
      pDVar2 = pDVar2 + uVar13;
      (pDVar2->runestr).rune = pRVar12->rune;
      (pDVar2->runestr).offset = uVar4;
      (pDVar2->runestr).len = uVar5;
      (pDVar2->runestr).unicode_offset = uVar6;
      p_Var3 = &local_40->root_->next->_M_h;
      if (p_Var3 == (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)0x0) {
LAB_0013d154:
        p_Var9 = (_Hash_node_base *)0x0;
      }
      else {
        pDVar2 = (local_58->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar11 = (ulong)pDVar2[uVar13].runestr.rune;
        p_Var8 = std::
                 _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 ::_M_find_before_node
                           (p_Var3,uVar11 % p_Var3->_M_bucket_count,(key_type *)(pDVar2 + uVar13),
                            uVar11);
        p_Var9 = (_Hash_node_base *)0x0;
        if (p_Var8 != (__node_base_ptr)0x0) {
          p_Var9 = p_Var8->_M_nxt;
        }
        if (p_Var9 == (_Hash_node_base *)0x0) goto LAB_0013d154;
        p_Var9 = p_Var9[2]._M_nxt;
      }
      if (p_Var9 == (_Hash_node_base *)0x0) {
        local_78.second = (DictUnit *)0x0;
      }
      else {
        local_78.second = (DictUnit *)p_Var9[1]._M_nxt;
      }
      local_78.first = uVar13;
      limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                (&(pvVar7->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar13].nexts,&local_78);
      uVar11 = uVar13 + 1;
      if (uVar11 < local_68) {
        uVar10 = 2;
        pRVar12 = local_60;
        do {
          if (((p_Var9 == (_Hash_node_base *)0x0) || (local_38 < uVar10)) ||
             (p_Var3 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)p_Var9->_M_nxt,
             p_Var3 == (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)0x0)) break;
          p_Var8 = std::
                   _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_cppjieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_int,_cppjieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::_M_find_before_node
                             (p_Var3,(ulong)pRVar12->rune % p_Var3->_M_bucket_count,&pRVar12->rune,
                              (ulong)pRVar12->rune);
          p_Var9 = (_Hash_node_base *)0x0;
          if (p_Var8 != (__node_base_ptr)0x0) {
            p_Var9 = p_Var8->_M_nxt;
          }
          if (p_Var9 == (_Hash_node_base *)0x0) break;
          p_Var9 = p_Var9[2]._M_nxt;
          if (p_Var9[1]._M_nxt != (_Hash_node_base *)0x0) {
            local_78.first = (uVar13 + uVar10) - 1;
            local_78.second = (DictUnit *)p_Var9[1]._M_nxt;
            limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::push_back
                      (&(local_58->super__Vector_base<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar13].nexts,&local_78);
          }
          uVar1 = uVar13 + uVar10;
          uVar10 = uVar10 + 1;
          pRVar12 = pRVar12 + 1;
        } while (uVar1 < local_68);
      }
      local_60 = local_60 + 1;
      uVar13 = uVar11;
    } while (uVar11 != local_50);
  }
  return;
}

Assistant:

void Find(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<struct Dag>&res, 
        size_t max_word_len = MAX_WORD_LENGTH) const {
    assert(root_ != NULL);
    res.resize(end - begin);

    const TrieNode *ptNode = NULL;
    TrieNode::NextMap::const_iterator citer;
    for (size_t i = 0; i < size_t(end - begin); i++) {
      res[i].runestr = *(begin + i);

      if (root_->next != NULL && root_->next->end() != (citer = root_->next->find(res[i].runestr.rune))) {
        ptNode = citer->second;
      } else {
        ptNode = NULL;
      }
      if (ptNode != NULL) {
        res[i].nexts.push_back(pair<size_t, const DictUnit*>(i, ptNode->ptValue));
      } else {
        res[i].nexts.push_back(pair<size_t, const DictUnit*>(i, static_cast<const DictUnit*>(NULL)));
      }

      for (size_t j = i + 1; j < size_t(end - begin) && (j - i + 1) <= max_word_len; j++) {
        if (ptNode == NULL || ptNode->next == NULL) {
          break;
        }
        citer = ptNode->next->find((begin + j)->rune);
        if (ptNode->next->end() == citer) {
          break;
        }
        ptNode = citer->second;
        if (NULL != ptNode->ptValue) {
          res[i].nexts.push_back(pair<size_t, const DictUnit*>(j, ptNode->ptValue));
        }
      }
    }
  }